

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,Const *const_)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  char *format;
  double dVar5;
  
  switch((const_->type_).enum_) {
  case V128:
    uVar2 = *(ulong *)(const_->data_).v;
    uVar3 = *(ulong *)((const_->data_).v + 8);
    Writef(this,"simde_wasm_i32x4_const(0x%08x, 0x%08x, 0x%08x, 0x%08x)",uVar2,uVar2 >> 0x20,uVar3,
           uVar3 >> 0x20);
    return;
  case F64:
    dVar5 = *(double *)(const_->data_).v;
    if ((~(ulong)dVar5 & 0x7ff0000000000000) != 0) {
      pcVar4 = "%.17g";
LAB_0019d381:
      Writef(this,pcVar4,dVar5);
      return;
    }
    pcVar4 = "  -";
    if (-1 < (long)dVar5) {
      pcVar4 = "\n\n";
    }
    if (((ulong)dVar5 & 0xfffffffffffff) != 0) {
      Writef(this,"f64_reinterpret_i64(0x%016lx) /* %snan:0x%013lx */");
      return;
    }
    break;
  case F32:
    fVar1 = *(float *)(const_->data_).v;
    if ((~(uint)fVar1 & 0x7f800000) != 0) {
      dVar5 = (double)fVar1;
      pcVar4 = "%.9g";
      goto LAB_0019d381;
    }
    pcVar4 = "  -";
    if (-1 < (int)fVar1) {
      pcVar4 = "\n\n";
    }
    if (((uint)fVar1 & 0x7fffff) != 0) {
      Writef(this,"f32_reinterpret_i32(0x%08x) /* %snan:0x%06x */");
      return;
    }
    break;
  case I64:
    pcVar4 = *(char **)(const_->data_).v;
    format = "%luull";
    goto LAB_0019d35d;
  case I32:
    Writef(this,"%uu",(ulong)*(uint *)(const_->data_).v);
    return;
  default:
    abort();
  }
  pcVar4 = pcVar4 + 2;
  format = "%sINFINITY";
LAB_0019d35d:
  Writef(this,format,pcVar4);
  return;
}

Assistant:

Type type() const { return type_; }